

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O0

void __thiscall hmi::window::window(window *this,string_view title,vec2i size,window_flags hints)

{
  int iVar1;
  Uint32 UVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  long *in_RDI;
  bool bVar8;
  Uint32 flags;
  string title_string;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined1 local_61 [49];
  vec_accessor local_30 [24];
  int local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 *local_8;
  
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  local_8 = &(anonymous_namespace)::g_loaded;
  local_c = 1;
  local_10 = 5;
  local_14 = 1;
  LOCK();
  iVar1 = (anonymous_namespace)::g_loaded + 1;
  UNLOCK();
  local_18 = (anonymous_namespace)::g_loaded;
  bVar8 = (anonymous_namespace)::g_loaded == 0;
  (anonymous_namespace)::g_loaded = iVar1;
  if (bVar8) {
    iVar1 = SDL_Init(0x20);
    if (iVar1 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to initialize SDL: ");
      pcVar5 = (char *)SDL_GetError();
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,'\n');
      return;
    }
    SDL_GL_SetAttribute(0x15,4);
    SDL_GL_SetAttribute(0x11,2);
    SDL_GL_SetAttribute(0x12,0);
  }
  __t = (basic_string_view<char,_std::char_traits<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff60,__t,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  UVar2 = anon_unknown_0::compute_sdl_flags(none);
  uVar6 = std::__cxx11::string::data();
  iVar1 = vec_accessor::operator_cast_to_int(local_30);
  iVar3 = vec_accessor::operator_cast_to_int(local_30);
  lVar7 = SDL_CreateWindow(uVar6,0x2fff0000,0x2fff0000,iVar1,iVar3,UVar2);
  *in_RDI = lVar7;
  if (*in_RDI == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to create window: ");
    pcVar5 = (char *)SDL_GetError();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,'\n');
  }
  std::__cxx11::string::~string((string *)(local_61 + 1));
  return;
}

Assistant:

window::window(std::string_view title, vec2i size, window_flags hints)
  : m_window(nullptr)
  , m_should_close(false)
  {
    if (g_loaded.fetch_add(1) == 0) { // we are the first
      if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        std::cerr << "Unable to initialize SDL: " << SDL_GetError() << '\n';
        return;
      }

      // must be set before window creating
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_PROFILE_MASK, SDL_GL_CONTEXT_PROFILE_ES);
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_MAJOR_VERSION, 2);
      SDL_GL_SetAttribute(SDL_GL_CONTEXT_MINOR_VERSION, 0);
    }

    std::string title_string(title);
    auto flags = compute_sdl_flags(hints);
    m_window = SDL_CreateWindow(title_string.data(), SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, size.width, size.height, flags);

    if (m_window == nullptr) {
      std::cerr << "Unable to create window: " << SDL_GetError() << '\n';
      return;
    }
  }